

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O2

void throughput_tcp_main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  epoll_event *__events;
  int64_t iVar6;
  int64_t iVar7;
  tcp_connection *ptVar8;
  request *prVar9;
  ssize_t sVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  char *__s;
  size_t *psVar14;
  long lVar15;
  long in_FS_OFFSET;
  byte_req_pair bVar16;
  int local_b4;
  timespec tx_timestamp;
  char hostname [64];
  
  iVar1 = throughput_open_connections();
  if (iVar1 != 0) {
    return;
  }
  iVar1 = get_conn_count();
  iVar2 = get_thread_count();
  __events = (epoll_event *)malloc((long)(iVar1 / iVar2) * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar6 = time_ns();
  do {
    while (iVar3 = should_load(), iVar3 == 0) {
      iVar6 = time_ns();
    }
    while ((iVar7 = time_ns(), iVar6 <= iVar7 &&
           (ptVar8 = pick_conn(), ptVar8 != (tcp_connection *)0x0))) {
      prVar9 = prepare_request();
      uVar13 = 0;
      uVar12 = (ulong)(uint)prVar9->iov_cnt;
      if (prVar9->iov_cnt < 1) {
        uVar12 = uVar13;
      }
      local_b4 = 0;
      for (; uVar12 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
        local_b4 = local_b4 + *(int *)((long)&prVar9->iovs[0].iov_len + uVar13);
      }
      iVar3 = 0;
      while( true ) {
        lVar15 = (long)iVar3;
        while( true ) {
          sVar10 = writev(ptVar8->fd,(iovec *)(prVar9->iovs + lVar15),prVar9->iov_cnt);
          uVar5 = (uint)sVar10;
          if (-1 < (int)uVar5) break;
          piVar11 = __errno_location();
          if (*piVar11 != 0xb) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            __s = "Unknown connection error write\n";
            goto LAB_00107fd5;
          }
        }
        local_b4 = local_b4 - uVar5;
        if (local_b4 == 0) break;
        iVar4 = prVar9->iov_cnt;
        iVar3 = iVar3 + iVar4;
        psVar14 = &prVar9->iovs[lVar15].iov_len;
        for (; lVar15 < iVar3; lVar15 = lVar15 + 1) {
          uVar13 = (ulong)(int)sVar10;
          uVar12 = *psVar14;
          sVar10 = uVar13 - uVar12;
          if (uVar13 < uVar12) {
            *psVar14 = uVar12 - uVar13;
            ((iovec *)(psVar14 + -1))->iov_base =
                 (void *)((long)((iovec *)(psVar14 + -1))->iov_base + uVar13);
            break;
          }
          iVar4 = iVar4 + -1;
          psVar14 = psVar14 + 2;
        }
        prVar9->iov_cnt = iVar4;
        iVar3 = (int)lVar15;
      }
      ptVar8->pending_reqs = ptVar8->pending_reqs + 1;
      time_ns_to_ts(&tx_timestamp);
      add_tx_timestamp(&tx_timestamp);
      bVar16.reqs = 1;
      bVar16.bytes = (ulong)(uVar5 & 0x7fffffff);
      add_throughput_tx_sample(bVar16);
      lVar15 = get_ia();
      iVar6 = iVar6 + lVar15;
    }
    uVar5 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1f8),__events,iVar1 / iVar2,0);
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = 0;
    }
    for (lVar15 = 0; uVar12 * 0xc - lVar15 != 0; lVar15 = lVar15 + 0xc) {
      if ((*(byte *)((long)&__events->events + lVar15) & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x150,"void throughput_tcp_main(void)");
      }
      ptVar8 = (tcp_connection *)
               ((long)*(int *)(&__events->field_0x4 + lVar15) * 0x400c +
               *(long *)(in_FS_OFFSET + -0x1f0));
      sVar10 = recv(ptVar8->fd,ptVar8->buffer + ptVar8->buffer_idx,
                    0x4000 - (ulong)ptVar8->buffer_idx,0);
      if ((int)sVar10 < 0) {
        piVar11 = __errno_location();
        if (*piVar11 != 0xb) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          __s = "Unknown connection error read\n";
LAB_00107fd5:
          perror(__s);
          return;
        }
LAB_00107f6e:
        ptVar8->buffer_idx = ptVar8->buffer_idx + (short)sVar10;
        bVar16 = handle_response(ptVar8);
        if (bVar16.reqs != 0) {
          ptVar8->pending_reqs = ptVar8->pending_reqs - (short)bVar16.reqs;
          add_throughput_rx_sample(bVar16);
        }
      }
      else {
        if ((int)sVar10 != 0) goto LAB_00107f6e;
        close(ptVar8->fd);
        gethostname(hostname,0x40);
        fprintf(_stderr,"[%s] ",hostname);
        fwrite("Connection closed\n",0x12,1,_stderr);
        ptVar8->closed = 1;
      }
    }
  } while( true );
}

Assistant:

static void throughput_tcp_main(void)
{
	int ready, idx, i, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp;
	int start_iov;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();
			bytes_to_send = 0;
			start_iov = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;
			while (1) {
				ret = writev(conn->fd, &to_send->iovs[start_iov], to_send->iov_cnt);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error write\n");
					return;
				}
				if (ret < 0)
					continue;
				if (ret == bytes_to_send)
					break;
				bytes_to_send -= ret;
				for (i = start_iov; i < start_iov + to_send->iov_cnt; i++) {
					if (ret < to_send->iovs[i].iov_len) {
						to_send->iovs[i].iov_len -= ret;
						to_send->iovs[i].iov_base += ret;
						break;
					}
					ret -= to_send->iovs[i].iov_len;
				}
				to_send->iov_cnt -= i - start_iov;
				start_iov = i;
			}
			conn->pending_reqs++;
			time_ns_to_ts(&tx_timestamp);
			add_tx_timestamp(&tx_timestamp);

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = recv(conn->fd, &conn->buffer[conn->buffer_idx],
						   MAX_PAYLOAD - conn->buffer_idx, 0);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;

				read_res = handle_response(conn);
				if (read_res.reqs > 0) {
					conn->pending_reqs -= read_res.reqs;
					/* Bookkeeping */
					add_throughput_rx_sample(read_res);
				}
			} else
				assert(0);
		}
	}
}